

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonmax.c
# Opt level: O2

xy * aom_nonmax_suppression
               (xy *corners,int *scores,int num_corners,int **ret_scores,int *ret_num_nonmax)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xy *__ptr;
  xy *pxVar6;
  void *__ptr_00;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int x;
  int iVar18;
  
  *ret_scores = (int *)0x0;
  *ret_num_nonmax = -1;
  if ((scores == (int *)0x0 || corners == (xy *)0x0) || num_corners < 1) {
    *ret_num_nonmax = 0;
  }
  else {
    uVar13 = (ulong)(uint)num_corners;
    __ptr = (xy *)malloc(uVar13 * 8);
    if (__ptr != (xy *)0x0) {
      pxVar6 = (xy *)malloc(uVar13 * 4);
      if (pxVar6 != (xy *)0x0) {
        iVar2 = corners[num_corners - 1U].y;
        __ptr_00 = malloc((long)iVar2 * 4 + 4);
        if (__ptr_00 != (void *)0x0) {
          for (lVar8 = 0; lVar8 <= iVar2; lVar8 = lVar8 + 1) {
            *(undefined4 *)((long)__ptr_00 + lVar8 * 4) = 0xffffffff;
          }
          iVar17 = -1;
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            iVar3 = corners[uVar9].y;
            if (iVar3 != iVar17) {
              *(int *)((long)__ptr_00 + (long)iVar3 * 4) = (int)uVar9;
              iVar17 = iVar3;
            }
          }
          uVar12 = 0;
          uVar9 = 0;
          lVar8 = 0;
          iVar17 = 0;
          do {
            if (uVar12 == uVar13) {
              free(__ptr_00);
              *ret_scores = (int *)pxVar6;
              *ret_num_nonmax = iVar17;
              return __ptr;
            }
            iVar3 = scores[uVar12];
            iVar4 = corners[uVar12].x;
            iVar5 = corners[uVar12].y;
            if (((((uVar12 == 0) || (corners[uVar12 - 1].x != iVar4 + -1)) ||
                 (corners[uVar12 - 1].y != iVar5)) || (scores[uVar12 - 1] < iVar3)) &&
               ((((long)(int)(num_corners - 1U) <= (long)uVar12 ||
                 (corners[uVar12 + 1].x != iVar4 + 1)) ||
                ((corners[uVar12 + 1].y != iVar5 || (scores[uVar12 + 1] < iVar3)))))) {
              if (0 < iVar5) {
                iVar18 = *(int *)((long)__ptr_00 + (ulong)(iVar5 - 1U) * 4);
                if (iVar18 != -1) {
                  iVar16 = (int)lVar8;
                  if (corners[(int)lVar8].y < (int)(iVar5 - 1U)) {
                    iVar16 = iVar18;
                  }
                  lVar8 = (long)iVar16;
                  lVar10 = lVar8 * 4;
                  for (; (iVar18 = corners[lVar8].y, iVar18 < iVar5 &&
                         (corners[lVar8].x < iVar4 + -1)); lVar8 = lVar8 + 1) {
                    lVar10 = lVar10 + 4;
                  }
                  iVar16 = iVar4 + 1;
                  while (iVar18 < iVar5) {
                    iVar18 = *(int *)((long)&corners->x + lVar10 * 2);
                    if (iVar18 != iVar16 && iVar16 <= iVar18) break;
                    if ((((iVar18 == iVar16) || (iVar18 == iVar4 + -1)) || (iVar18 == iVar4)) &&
                       (iVar3 <= *(int *)((long)scores + lVar10))) goto LAB_0035f411;
                    lVar1 = lVar10 * 2;
                    lVar10 = lVar10 + 4;
                    iVar18 = *(int *)((long)&corners[1].y + lVar1);
                  }
                }
              }
              if (((iVar5 < iVar2) &&
                  (uVar7 = *(uint *)((long)__ptr_00 + (long)iVar5 * 4 + 4), uVar7 != 0xffffffff)) &&
                 (uVar14 = (uint)uVar9, (int)uVar14 < num_corners)) {
                if (iVar5 < corners[(int)uVar14].y) {
                  uVar7 = uVar14;
                }
                uVar15 = (ulong)(int)uVar7;
                uVar11 = (ulong)(uint)num_corners;
                if (num_corners < (int)uVar7) {
                  uVar11 = (ulong)uVar7;
                }
                for (; ((uVar9 = uVar11, (long)uVar15 < (long)uVar13 &&
                        (uVar9 = uVar15, corners[uVar15].y == iVar5 + 1)) &&
                       (corners[uVar15].x < iVar4 + -1)); uVar15 = uVar15 + 1) {
                }
                iVar18 = iVar4 + 1;
                for (lVar10 = (long)(int)uVar9;
                    (lVar10 < (long)uVar13 && (corners[lVar10].y == iVar5 + 1)); lVar10 = lVar10 + 1
                    ) {
                  iVar16 = corners[lVar10].x;
                  if (iVar16 != iVar18 && iVar18 <= iVar16) break;
                  if ((((iVar16 == iVar18) || (iVar16 == iVar4 + -1)) || (iVar16 == iVar4)) &&
                     (iVar3 <= scores[lVar10])) goto LAB_0035f411;
                }
              }
              __ptr[iVar17] = corners[uVar12];
              (&pxVar6->x)[iVar17] = iVar3;
              iVar17 = iVar17 + 1;
            }
LAB_0035f411:
            uVar12 = uVar12 + 1;
          } while( true );
        }
        free(__ptr);
        __ptr = pxVar6;
      }
      free(__ptr);
    }
  }
  return (xy *)0x0;
}

Assistant:

xy* aom_nonmax_suppression(const xy* corners, const int* scores, int num_corners,
                           int** ret_scores, int* ret_num_nonmax)
{
  int num_nonmax=0;
  int last_row;
  int* row_start;
  int i, j;
  xy* ret_nonmax;
  int* nonmax_scores;
  const int sz = (int)num_corners;

  /*Point above points (roughly) to the pixel above the one of interest, if there
    is a feature there.*/
  int point_above = 0;
  int point_below = 0;

  *ret_scores = 0;
  *ret_num_nonmax = -1;
  if(!(corners && scores) || num_corners < 1)
  {
    *ret_num_nonmax = 0;
    return 0;
  }

  ret_nonmax = (xy*)malloc(num_corners * sizeof(xy));
  if(!ret_nonmax)
  {
    return 0;
  }

  nonmax_scores = (int*)malloc(num_corners * sizeof(*nonmax_scores));
  if (!nonmax_scores)
  {
    free(ret_nonmax);
    return 0;
  }

  /* Find where each row begins
     (the corners are output in raster scan order). A beginning of -1 signifies
     that there are no corners on that row. */
  last_row = corners[num_corners-1].y;
  row_start = (int*)malloc((last_row+1)*sizeof(int));
  if(!row_start)
  {
    free(ret_nonmax);
    free(nonmax_scores);
    return 0;
  }

  for(i=0; i < last_row+1; i++)
    row_start[i] = -1;

  {
    int prev_row = -1;
    for(i=0; i< num_corners; i++)
      if(corners[i].y != prev_row)
      {
        row_start[corners[i].y] = i;
        prev_row = corners[i].y;
      }
  }



  for(i=0; i < sz; i++)
  {
    int score = scores[i];
    xy pos = corners[i];
    assert(pos.y <= last_row);

    /*Check left */
    if(i > 0)
      if(corners[i-1].x == pos.x-1 && corners[i-1].y == pos.y && Compare(scores[i-1], score))
        continue;

    /*Check right*/
    if(i < (sz - 1))
      if(corners[i+1].x == pos.x+1 && corners[i+1].y == pos.y && Compare(scores[i+1], score))
        continue;

    /*Check above (if there is a valid row above)*/
    if(pos.y > 0 && row_start[pos.y - 1] != -1)
    {
      /*Make sure that current point_above is one
        row above.*/
      if(corners[point_above].y < pos.y - 1)
        point_above = row_start[pos.y-1];

      /*Make point_above point to the first of the pixels above the current point,
        if it exists.*/
      for(; corners[point_above].y < pos.y && corners[point_above].x < pos.x - 1; point_above++)
      {}


      for(j=point_above; corners[j].y < pos.y && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j], score))
          goto cont;
      }

    }

    /*Check below (if there is anything below)*/
    if (pos.y + 1 < last_row+1 && row_start[pos.y + 1] != -1 && point_below < sz) /*Nothing below*/
    {
      if(corners[point_below].y < pos.y + 1)
        point_below = row_start[pos.y+1];

      /* Make point below point to one of the pixels belowthe current point, if it
         exists.*/
      for(; point_below < sz && corners[point_below].y == pos.y+1 && corners[point_below].x < pos.x - 1; point_below++)
      {}

      for(j=point_below; j < sz && corners[j].y == pos.y+1 && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j],score))
          goto cont;
      }
    }

    ret_nonmax[num_nonmax] = corners[i];
    nonmax_scores[num_nonmax] = scores[i];
    num_nonmax++;
cont:
    ;
  }

  free(row_start);
  *ret_scores = nonmax_scores;
  *ret_num_nonmax = num_nonmax;
  return ret_nonmax;
}